

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::_::
CopyConstructArray_<capnp::_::RpcSystemBase::RpcConnectionState::Question,_capnp::_::RpcSystemBase::RpcConnectionState::Question_*,_true,_false>
::ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  Question *this_00;
  
  while (this->start < this->pos) {
    this_00 = this->pos + -1;
    this->pos = this_00;
    Array<unsigned_int>::~Array(&this_00->paramExports);
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }